

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O2

size_t __thiscall xmrig::OclCnRunner::bufferSize(OclCnRunner *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = OclBaseRunner::bufferSize(&this->super_OclBaseRunner);
  sVar2 = OclBaseRunner::align
                    (&this->super_OclBaseRunner,
                     (ulong)(this->super_OclBaseRunner).m_intensity << 0x14);
  sVar3 = OclBaseRunner::align
                    (&this->super_OclBaseRunner,
                     (ulong)((this->super_OclBaseRunner).m_intensity * 200));
  sVar4 = OclBaseRunner::align
                    (&this->super_OclBaseRunner,
                     (ulong)((this->super_OclBaseRunner).m_intensity + 2) << 2);
  return sVar3 + sVar2 + sVar1 + sVar4 * 4;
}

Assistant:

size_t xmrig::OclCnRunner::bufferSize() const
{
    return OclBaseRunner::bufferSize() +
           align(CnAlgo::CN_MEMORY * m_intensity) +
           align(200 * m_intensity) +
           (align(sizeof(cl_uint) * (m_intensity + 2)) * BRANCH_MAX);
}